

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall TcpSocketImpl::~TcpSocketImpl(TcpSocketImpl *this)

{
  mutex *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  int iVar4;
  
  (this->super_BaseSocketImpl)._vptr_BaseSocketImpl = (_func_int **)&PTR__TcpSocketImpl_001463e0;
  (this->super_BaseSocketImpl).m_bStop = true;
  __mutex = &(this->super_BaseSocketImpl).m_mxWrite;
  iVar4 = pthread_mutex_trylock((pthread_mutex_t *)__mutex);
  this->m_bCloseReq = true;
  LOCK();
  (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  std::condition_variable::notify_all();
  if (iVar4 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  if ((this->m_thConnect)._M_id._M_thread != 0) {
    std::thread::join();
  }
  iVar4 = (this->super_BaseSocketImpl).m_fSock;
  if (iVar4 != -1) {
    close(iVar4);
    (this->super_BaseSocketImpl).m_fSock = -1;
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
  }
  p_Var2 = (this->m_fClientConnectedSsl).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_fClientConnectedSsl,(_Any_data *)&this->m_fClientConnectedSsl,
              __destroy_functor);
  }
  p_Var2 = (this->m_fBytesReceivedParam).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_fBytesReceivedParam,(_Any_data *)&this->m_fBytesReceivedParam,
              __destroy_functor);
  }
  p_Var2 = (this->m_fBytesReceived).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->m_fBytesReceived,(_Any_data *)&this->m_fBytesReceived,
              __destroy_functor);
  }
  pcVar3 = (this->m_strIFaceAddr)._M_dataplus._M_p;
  paVar1 = &(this->m_strIFaceAddr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_strClientAddr)._M_dataplus._M_p;
  paVar1 = &(this->m_strClientAddr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::condition_variable::~condition_variable(&this->m_cv);
  if ((this->m_thConnect)._M_id._M_thread == 0) {
    p_Var2 = (this->m_fClientConnectedParam).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->m_fClientConnectedParam,
                (_Any_data *)&this->m_fClientConnectedParam,__destroy_functor);
    }
    p_Var2 = (this->m_fClientConnected).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->m_fClientConnected,(_Any_data *)&this->m_fClientConnected,
                __destroy_functor);
    }
    std::
    deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
    ::~deque(&this->m_quOutData);
    p_Var2 = (this->m_fnSslEncode).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->m_fnSslEncode,(_Any_data *)&this->m_fnSslEncode,
                __destroy_functor);
    }
    std::
    deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
    ::~deque(&this->m_quInData);
    p_Var2 = (this->m_fnSslDecode).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->m_fnSslDecode,(_Any_data *)&this->m_fnSslDecode,
                __destroy_functor);
    }
    std::
    deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
    ::~deque(&this->m_quTmpOutData);
    p_Var2 = (this->m_fnSslInitDone).super__Function_base._M_manager;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)((_Any_data *)&this->m_fnSslInitDone,(_Any_data *)&this->m_fnSslInitDone,
                __destroy_functor);
    }
    BaseSocketImpl::~BaseSocketImpl(&this->super_BaseSocketImpl);
    return;
  }
  std::terminate();
}

Assistant:

TcpSocketImpl::~TcpSocketImpl()
{
    //OutputDebugString(L"TcpSocketImpl::~TcpSocketImpl\r\n");
    m_bStop = true; // Stops the listening thread
    const bool bIsLocked = m_mxWrite.try_lock();
    m_bCloseReq = true;
    m_atOutBytes = 0;
    m_cv.notify_all();
    if (bIsLocked == true)
        m_mxWrite.unlock();

    if (m_thConnect.joinable() == true)
        m_thConnect.join();

    if (m_fSock != INVALID_SOCKET)
    {
        ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        StartClosingCB();
    }
}